

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

TypeKind google::protobuf::internal::CppTypeToTypeKind(CppType type)

{
  if (type - CPPTYPE_INT32 < 10) {
    return (&DAT_003d9d20)[type - CPPTYPE_INT32];
  }
  Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
              ,0x85);
}

Assistant:

static UntypedMapBase::TypeKind CppTypeToTypeKind(
    FieldDescriptor::CppType type) {
  using TK = UntypedMapBase::TypeKind;
  switch (type) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return TK::kBool;
    case FieldDescriptor::CPPTYPE_INT32:
      return TK::kU32;
    case FieldDescriptor::CPPTYPE_UINT32:
      return TK::kU32;
    case FieldDescriptor::CPPTYPE_ENUM:
      return TK::kU32;
    case FieldDescriptor::CPPTYPE_INT64:
      return TK::kU64;
    case FieldDescriptor::CPPTYPE_UINT64:
      return TK::kU64;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return TK::kFloat;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return TK::kDouble;
    case FieldDescriptor::CPPTYPE_STRING:
      return TK::kString;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return TK::kMessage;
    default:
      Unreachable();
  }
}